

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

TokenOrSyntax * __thiscall
slang::syntax::ConditionalPropertyExprSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,ConditionalPropertyExprSyntax *this,size_t index)

{
  ElsePropertyClauseSyntax *pEVar1;
  Token local_20;
  
  switch(index) {
  case 0:
    local_20.kind = (this->ifKeyword).kind;
    local_20._2_1_ = (this->ifKeyword).field_0x2;
    local_20.numFlags.raw = (this->ifKeyword).numFlags.raw;
    local_20.rawLen = (this->ifKeyword).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->ifKeyword).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->ifKeyword).info + 4);
    break;
  case 1:
    local_20.kind = (this->openParen).kind;
    local_20._2_1_ = (this->openParen).field_0x2;
    local_20.numFlags.raw = (this->openParen).numFlags.raw;
    local_20.rawLen = (this->openParen).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->openParen).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->openParen).info + 4);
    break;
  case 2:
    pEVar1 = (ElsePropertyClauseSyntax *)(this->condition).ptr;
    goto LAB_003097c4;
  case 3:
    local_20.kind = (this->closeParen).kind;
    local_20._2_1_ = (this->closeParen).field_0x2;
    local_20.numFlags.raw = (this->closeParen).numFlags.raw;
    local_20.rawLen = (this->closeParen).rawLen;
    local_20.info._0_4_ = *(undefined4 *)&(this->closeParen).info;
    local_20.info._4_4_ = *(undefined4 *)((long)&(this->closeParen).info + 4);
    break;
  case 4:
    pEVar1 = (ElsePropertyClauseSyntax *)(this->expr).ptr;
    goto LAB_003097c4;
  case 5:
    pEVar1 = this->elseClause;
LAB_003097c4:
    *(ElsePropertyClauseSyntax **)
     &(__return_storage_ptr__->super_ConstTokenOrSyntax).
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = pEVar1;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
             super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
             super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10
     ) = '\x01';
    return __return_storage_ptr__;
  default:
    parsing::Token::Token(&local_20);
  }
  *(undefined4 *)
   &(__return_storage_ptr__->super_ConstTokenOrSyntax).
    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
       local_20._0_4_;
  *(uint32_t *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 4) =
       local_20.rawLen;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 8) =
       local_20.info._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0xc) =
       local_20.info._4_4_;
  *(__index_type *)
   ((long)&(__return_storage_ptr__->super_ConstTokenOrSyntax).
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> + 0x10)
       = '\0';
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax ConditionalPropertyExprSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return ifKeyword;
        case 1: return openParen;
        case 2: return condition.get();
        case 3: return closeParen;
        case 4: return expr.get();
        case 5: return elseClause;
        default: return nullptr;
    }
}